

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O3

void okim6295_w(void *info,UINT8 offset,UINT8 data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar6;
  undefined7 in_register_00000031;
  undefined8 uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  
  switch(CONCAT71(in_register_00000031,offset) & 0xffffffff) {
  case 0:
    if (*(short *)((long)info + 200) == -1) {
      if (-1 < (char)data) {
        bVar1 = data >> 3;
        lVar8 = 0x20;
        do {
          if ((bVar1 & 1) != 0) {
            *(undefined1 *)((long)info + lVar8) = 0;
          }
          bVar1 = bVar1 >> 1;
          lVar8 = lVar8 + 0x30;
        } while (lVar8 != 0xe0);
        return;
      }
      uVar4 = (ushort)(data & 0x7f);
    }
    else {
      uVar6 = (ulong)(data >> 4);
      lVar8 = 0;
      do {
        if (((uVar6 & 1) != 0) && (*(char *)((long)info + lVar8 + 0x20) == '\0')) {
          iVar10 = (int)*(short *)((long)info + 200);
          bVar1 = memory_raw_read_byte((okim6295_state *)info,iVar10 * 8);
          bVar2 = memory_raw_read_byte((okim6295_state *)info,iVar10 * 8 + 1);
          bVar3 = memory_raw_read_byte((okim6295_state *)info,iVar10 * 8 + 2);
          uVar9 = (bVar1 & 3) << 0x10 | (uint)bVar2 << 8 | (uint)bVar3;
          bVar1 = memory_raw_read_byte((okim6295_state *)info,iVar10 * 8 + 3);
          bVar2 = memory_raw_read_byte((okim6295_state *)info,iVar10 * 8 + 4);
          bVar3 = memory_raw_read_byte((okim6295_state *)info,iVar10 * 8 + 5);
          uVar5 = (bVar1 & 3) << 0x10 | (uint)bVar2 << 8 | (uint)bVar3;
          iVar10 = uVar5 - uVar9;
          if (uVar5 < uVar9 || iVar10 == 0) {
            *(undefined1 *)((long)info + lVar8 + 0x20) = 0;
          }
          else {
            *(undefined1 *)((long)info + lVar8 + 0x20) = 1;
            *(uint *)((long)info + lVar8 + 0x24) = uVar9;
            *(undefined4 *)((long)info + lVar8 + 0x28) = 0;
            *(int *)((long)info + lVar8 + 0x2c) = iVar10 * 2 + 2;
            oki_adpcm_reset((oki_adpcm_state *)((long)info + lVar8 + 8));
            *(int *)((long)info + lVar8 + 0x30) = volume_table[data & 0xf];
          }
        }
        uVar6 = uVar6 >> 1;
        lVar8 = lVar8 + 0x30;
      } while (lVar8 != 0xc0);
      uVar4 = 0xffff;
    }
    *(ushort *)((long)info + 200) = uVar4;
    break;
  case 8:
    *(UINT8 *)((long)info + 0xd8) = data;
    break;
  case 9:
    *(UINT8 *)((long)info + 0xd9) = data;
    break;
  case 10:
    *(UINT8 *)((long)info + 0xda) = data;
    break;
  case 0xb:
    uVar5 = (uint)data << 0x18 | *(uint *)((long)info + 0xd8) & 0xffffff;
    *(uint *)((long)info + 0xd8) = uVar5;
    UNRECOVERED_JUMPTABLE = *(code **)((long)info + 0xf0);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      uVar9 = 0x84;
      if (*(char *)((long)info + 0xd0) == '\0') {
        uVar9 = 0xa5;
      }
      uVar7 = *(undefined8 *)((long)info + 0xf8);
LAB_00166793:
      (*UNRECOVERED_JUMPTABLE)(uVar7,(ulong)uVar5 / (ulong)uVar9,(ulong)uVar5 % (ulong)uVar9);
      return;
    }
    break;
  case 0xc:
    *(UINT8 *)((long)info + 0xd0) = data;
    UNRECOVERED_JUMPTABLE = *(code **)((long)info + 0xf0);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      uVar9 = 0x84;
      if (data == '\0') {
        uVar9 = 0xa5;
      }
      uVar7 = *(undefined8 *)((long)info + 0xf8);
      uVar5 = *(uint *)((long)info + 0xd8);
      goto LAB_00166793;
    }
    break;
  case 0xe:
    *(UINT8 *)((long)info + 0xd2) = data;
    break;
  case 0xf:
    *(uint *)((long)info + 0xcc) = (uint)data << 0x12;
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    *(UINT8 *)((long)info + (ulong)(offset & 3) + 0xd3) = data;
  }
  return;
}

Assistant:

static void okim6295_w(void* info, UINT8 offset, UINT8 data)
{
	okim6295_state *chip = (okim6295_state *)info;
	
	switch(offset)
	{
	case 0x00:
		okim6295_write_command(chip, data);
		break;
	case 0x08:
		chip->master_clock &= ~0x000000FF;
		chip->master_clock |= data <<  0;
		break;
	case 0x09:
		chip->master_clock &= ~0x0000FF00;
		chip->master_clock |= data <<  8;
		break;
	case 0x0A:
		chip->master_clock &= ~0x00FF0000;
		chip->master_clock |= data << 16;
		break;
	case 0x0B:
		chip->master_clock &= ~0xFF000000;
		chip->master_clock |= data << 24;
		okim6295_clock_changed(chip);
		break;
	case 0x0C:
		okim6295_set_pin7(chip, data);
		break;
	case 0x0E:	// NMK112 bank switch enable
		chip->nmk_mode = data;
		break;
	case 0x0F:
		okim6295_set_bank_base(chip, data << 18);
		break;
	case 0x10:
	case 0x11:
	case 0x12:
	case 0x13:
		chip->nmk_bank[offset & 0x03] = data;
		break;
	}
	
	return;
}